

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath * testing::internal::FilePath::GetCurrentDir(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  size_t sVar3;
  FilePath *in_RDI;
  char *__s;
  char cwd [4097];
  char *local_1048;
  size_type local_1040;
  char local_1038;
  undefined7 uStack_1037;
  undefined8 uStack_1030;
  char local_1028 [4104];
  
  memset(local_1028,0,0x1001);
  pcVar2 = getcwd(local_1028,0x1001);
  __s = "";
  if (pcVar2 != (char *)0x0) {
    __s = local_1028;
  }
  local_1048 = &local_1038;
  sVar3 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1048,__s,__s + sVar3);
  paVar1 = &(in_RDI->pathname_).field_2;
  (in_RDI->pathname_)._M_dataplus._M_p = (pointer)paVar1;
  if (local_1048 == &local_1038) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_1037,local_1038);
    *(undefined8 *)((long)&(in_RDI->pathname_).field_2 + 8) = uStack_1030;
  }
  else {
    (in_RDI->pathname_)._M_dataplus._M_p = local_1048;
    (in_RDI->pathname_).field_2._M_allocated_capacity = CONCAT71(uStack_1037,local_1038);
  }
  (in_RDI->pathname_)._M_string_length = local_1040;
  local_1040 = 0;
  local_1038 = '\0';
  local_1048 = &local_1038;
  Normalize(in_RDI);
  if (local_1048 != &local_1038) {
    operator_delete(local_1048,CONCAT71(uStack_1037,local_1038) + 1);
  }
  return in_RDI;
}

Assistant:

FilePath FilePath::GetCurrentDir() {
#if defined(GTEST_OS_WINDOWS_MOBILE) || defined(GTEST_OS_WINDOWS_PHONE) || \
    defined(GTEST_OS_WINDOWS_RT) || defined(GTEST_OS_ESP8266) ||           \
    defined(GTEST_OS_ESP32) || defined(GTEST_OS_XTENSA) ||                 \
    defined(GTEST_OS_QURT) || defined(GTEST_OS_NXP_QN9090) ||              \
    defined(GTEST_OS_NRF52)
  // These platforms do not have a current directory, so we just return
  // something reasonable.
  return FilePath(kCurrentDirectoryString);
#elif defined(GTEST_OS_WINDOWS)
  char cwd[GTEST_PATH_MAX_ + 1] = {'\0'};
  return FilePath(_getcwd(cwd, sizeof(cwd)) == nullptr ? "" : cwd);
#else
  char cwd[GTEST_PATH_MAX_ + 1] = {'\0'};
  char* result = getcwd(cwd, sizeof(cwd));
#ifdef GTEST_OS_NACL
  // getcwd will likely fail in NaCl due to the sandbox, so return something
  // reasonable. The user may have provided a shim implementation for getcwd,
  // however, so fallback only when failure is detected.
  return FilePath(result == nullptr ? kCurrentDirectoryString : cwd);
#endif  // GTEST_OS_NACL
  return FilePath(result == nullptr ? "" : cwd);
#endif  // GTEST_OS_WINDOWS_MOBILE
}